

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_perlin_noise_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int offset_x,int offset_y,
          float scale,rf_color *dst,rf_int dst_size)

{
  rf_color *prVar1;
  undefined1 auVar2 [16];
  uchar uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  rf_color *prVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  long local_b8;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      local_b8 = 0;
      do {
        if (0 < width) {
          prVar1 = dst + local_b8 * width;
          lVar11 = 0;
          prVar9 = dst;
          do {
            iVar15 = 0;
            fVar24 = 0.0;
            fVar30 = 1.0;
            fVar31 = 1.0;
            do {
              fVar25 = (((float)(offset_y + local_b8) * scale) / (float)height) * fVar31;
              fVar26 = (((float)(offset_x + lVar11) * scale) / (float)width) * fVar31;
              iVar20 = -(uint)(fVar25 < (float)(int)fVar25);
              iVar21 = -(uint)(fVar26 < (float)(int)fVar26);
              auVar2._4_4_ = iVar20;
              auVar2._0_4_ = iVar20;
              auVar2._8_4_ = iVar21;
              auVar2._12_4_ = iVar21;
              uVar7 = movmskpd((int)prVar9,auVar2);
              uVar17 = (int)fVar25 - (uVar7 & 1);
              uVar16 = (int)fVar26 - (uVar7 >> 1 & 0x7f);
              uVar7 = (int)fVar31 - (uint)(fVar31 < (float)(int)fVar31);
              uVar12 = (ulong)(uVar17 + 1 & 0xff);
              uVar4 = (ulong)(uVar7 & 0xff);
              uVar10 = (ulong)(uVar7 + 1 & 0xff);
              fVar26 = fVar26 - (float)(int)uVar16;
              fVar25 = fVar25 - (float)(int)uVar17;
              fVar27 = fVar31 - (float)(int)uVar7;
              lVar8 = (ulong)"\a\t\x05"
                             [uVar4 + stb__perlin_randtab
                                      [(ulong)(uVar17 & 0xff) +
                                       (ulong)stb__perlin_randtab[(uVar16 & 0xff) + iVar15]]] * 0x10
              ;
              lVar13 = (ulong)"\a\t\x05"
                              [stb__perlin_randtab
                               [(ulong)(uVar17 & 0xff) +
                                (ulong)stb__perlin_randtab[(uVar16 & 0xff) + iVar15]] + uVar10] *
                       0x10;
              lVar18 = (ulong)"\a\t\x05"
                              [uVar4 + stb__perlin_randtab
                                       [stb__perlin_randtab[(uVar16 & 0xff) + iVar15] + uVar12]] *
                       0x10;
              lVar19 = (ulong)"\a\t\x05"
                              [uVar4 + stb__perlin_randtab
                                       [(ulong)(uVar17 & 0xff) +
                                        (ulong)stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar15]]] *
                       0x10;
              lVar14 = (ulong)"\a\t\x05"
                              [stb__perlin_randtab
                               [(ulong)(uVar17 & 0xff) +
                                (ulong)stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar15]] + uVar10]
                       * 0x10;
              fVar29 = fVar26 + -1.0;
              fVar34 = ((fVar25 * 6.0 + -15.0) * fVar25 + 10.0) * fVar25 * fVar25 * fVar25;
              lVar5 = (ulong)"\a\t\x05"
                             [uVar4 + stb__perlin_randtab
                                      [uVar12 + stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar15]]]
                      * 0x10;
              fVar28 = fVar27 + -1.0;
              fVar22 = fVar25 + -1.0;
              lVar6 = (ulong)"\a\t\x05"
                             [stb__perlin_randtab
                              [stb__perlin_randtab[(uVar16 & 0xff) + iVar15] + uVar12] + uVar10] *
                      0x10;
              fVar35 = ((fVar27 * 6.0 + -15.0) * fVar27 + 10.0) * fVar27 * fVar27 * fVar27;
              prVar9 = (rf_color *)
                       ((ulong)"\a\t\x05"
                               [uVar10 + stb__perlin_randtab
                                         [uVar12 + stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar15]
                                         ]] * 0x10);
              fVar32 = *(float *)(stb__perlin_grad_basis + lVar19 + 8) * fVar27 +
                       *(float *)(stb__perlin_grad_basis + lVar19) * fVar29 +
                       *(float *)(stb__perlin_grad_basis + lVar19 + 4) * fVar25;
              fVar33 = *(float *)(stb__perlin_grad_basis + lVar8 + 8) * fVar27 +
                       *(float *)(stb__perlin_grad_basis + lVar8) * fVar26 +
                       *(float *)(stb__perlin_grad_basis + lVar8 + 4) * fVar25;
              fVar23 = *(float *)(stb__perlin_grad_basis + lVar5 + 8) * fVar27 +
                       *(float *)(stb__perlin_grad_basis + lVar5) * fVar29 +
                       *(float *)(stb__perlin_grad_basis + lVar5 + 4) * fVar22;
              fVar27 = *(float *)(stb__perlin_grad_basis + lVar18 + 8) * fVar27 +
                       *(float *)(stb__perlin_grad_basis + lVar18) * fVar26 +
                       *(float *)(stb__perlin_grad_basis + lVar18 + 4) * fVar22;
              fVar32 = ((*(float *)(stb__perlin_grad_basis + lVar14 + 8) * fVar28 +
                        *(float *)(stb__perlin_grad_basis + lVar14) * fVar29 +
                        *(float *)(stb__perlin_grad_basis + lVar14 + 4) * fVar25) - fVar32) * fVar35
                       + fVar32;
              fVar33 = ((*(float *)(stb__perlin_grad_basis + lVar13 + 8) * fVar28 +
                        *(float *)(stb__perlin_grad_basis + lVar13) * fVar26 +
                        *(float *)(stb__perlin_grad_basis + lVar13 + 4) * fVar25) - fVar33) * fVar35
                       + fVar33;
              fVar33 = fVar34 * ((((*(float *)(stb__perlin_grad_basis + lVar6 + 8) * fVar28 +
                                   *(float *)(stb__perlin_grad_basis + lVar6) * fVar26 +
                                   *(float *)(stb__perlin_grad_basis + lVar6 + 4) * fVar22) - fVar27
                                  ) * fVar35 + fVar27) - fVar33) + fVar33;
              fVar24 = fVar24 + (((fVar34 * (((((float)prVar9[0x5e91a] * fVar28 +
                                               (float)prVar9[0x5e918] * fVar29 +
                                               (float)prVar9[0x5e919] * fVar22) - fVar23) * fVar35 +
                                             fVar23) - fVar32) + fVar32) - fVar33) *
                                 ((fVar26 * 6.0 + -15.0) * fVar26 + 10.0) * fVar26 * fVar26 * fVar26
                                + fVar33) * fVar30;
              fVar30 = fVar30 * 0.5;
              fVar31 = fVar31 * 2.0;
              iVar15 = iVar15 + 1;
            } while (iVar15 != 6);
            uVar3 = (uchar)(int)((fVar24 + 1.0) * 0.5 * 255.0);
            prVar1[lVar11].r = uVar3;
            prVar1[lVar11].g = uVar3;
            prVar1[lVar11].b = uVar3;
            prVar1[lVar11].a = 0xff;
            lVar11 = lVar11 + 1;
            prVar9 = prVar1;
          } while (lVar11 != width);
        }
        local_b8 = local_b8 + 1;
      } while (local_b8 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_perlin_noise_to_buffer(int width, int height, int offset_x, int offset_y, float scale, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float nx = (float)(x + offset_x)*scale/(float)width;
                float ny = (float)(y + offset_y)*scale/(float)height;

                // Typical values to start playing with:
                //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
                //   gain       =  0.5   -- relative weighting applied to each successive octave
                //   octaves    =  6     -- number of "octaves" of noise3() to sum

                // NOTE: We need to translate the data from [-1..1] to [0..1]
                float p = (stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6) + 1.0f) / 2.0f;

                int intensity = (int)(p * 255.0f);
                dst[y * width + x] = (rf_color){ intensity, intensity, intensity, 255 };
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}